

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O0

void av1_svc_set_reference_was_previous(AV1_COMP *cpi)

{
  AV1_PRIMARY *pAVar1;
  uint local_20;
  int ref_frame_map_idx;
  uint i;
  uint current_frame;
  RTC_REF *rtc_ref;
  AV1_COMP *cpi_local;
  
  pAVar1 = cpi->ppi;
  if (cpi->ppi->use_svc == 0) {
    local_20 = (cpi->common).current_frame.frame_number;
  }
  else {
    local_20 = (cpi->svc).current_superframe;
  }
  (pAVar1->rtc_ref).reference_was_previous_frame = true;
  if (local_20 != 0) {
    (pAVar1->rtc_ref).reference_was_previous_frame = false;
    for (i = 0; i < 7; i = i + 1) {
      if (((pAVar1->rtc_ref).reference[i] != 0) &&
         ((pAVar1->rtc_ref).buffer_time_index[(pAVar1->rtc_ref).ref_idx[i]] == local_20 - 1)) {
        (pAVar1->rtc_ref).reference_was_previous_frame = true;
      }
    }
  }
  return;
}

Assistant:

void av1_svc_set_reference_was_previous(AV1_COMP *cpi) {
  RTC_REF *const rtc_ref = &cpi->ppi->rtc_ref;
  // Check if the encoded frame had some reference that was the
  // previous frame.
  const unsigned int current_frame =
      cpi->ppi->use_svc ? cpi->svc.current_superframe
                        : cpi->common.current_frame.frame_number;
  rtc_ref->reference_was_previous_frame = true;
  if (current_frame > 0) {
    rtc_ref->reference_was_previous_frame = false;
    for (unsigned int i = 0; i < INTER_REFS_PER_FRAME; i++) {
      if (rtc_ref->reference[i]) {
        const int ref_frame_map_idx = rtc_ref->ref_idx[i];
        if (rtc_ref->buffer_time_index[ref_frame_map_idx] == current_frame - 1)
          rtc_ref->reference_was_previous_frame = true;
      }
    }
  }
}